

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSetIterator.cpp
# Opt level: O0

Var Js::JavascriptSetIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  JavascriptSet **ppJVar5;
  void **ppvVar6;
  JavascriptArray *pJVar7;
  JavascriptArray *keyValueTuple;
  Var result;
  void *value;
  Iterator *local_78;
  Type *setIterator;
  JavascriptSet *set;
  JavascriptSetIterator *iterator;
  Var thisObj;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                ,0x16,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  thisObj = ScriptContext::GetLibrary((ScriptContext *)library);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                ,0x1a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iterator = (JavascriptSetIterator *)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptSetIterator>(iterator);
  if (bVar2) {
    set = (JavascriptSet *)VarTo<Js::JavascriptSetIterator>(iterator);
    ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptSet__
                        ((WriteBarrierPtr *)&set->list);
    setIterator = (Type *)*ppJVar5;
    local_78 = (Iterator *)&(set->list).last;
    if (((JavascriptSet *)setIterator == (JavascriptSet *)0x0) ||
       (bVar2 = MapOrSetDataList<void_*>::Iterator::Next(local_78), !bVar2)) {
      value = (void *)0x0;
      Memory::WriteBarrierPtr<Js::JavascriptSet>::operator=
                ((WriteBarrierPtr<Js::JavascriptSet> *)&set->list,&value);
      callInfo_local =
           (CallInfo)JavascriptLibrary::CreateIteratorResultObjectDone((JavascriptLibrary *)thisObj)
      ;
    }
    else {
      ppvVar6 = MapOrSetDataList<void_*>::Iterator::Current(local_78);
      keyValueTuple = (JavascriptArray *)*ppvVar6;
      if (*(int *)&set->kind == 1) {
        pJVar7 = JavascriptLibrary::CreateArray((JavascriptLibrary *)thisObj,2);
        (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar7,0,keyValueTuple);
        (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar7,1,keyValueTuple,0);
        keyValueTuple = pJVar7;
      }
      else if (*(int *)&set->kind != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                    ,0x39,"(iterator->m_kind == JavascriptSetIteratorKind::Value)",
                                    "iterator->m_kind == JavascriptSetIteratorKind::Value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      callInfo_local =
           (CallInfo)
           JavascriptLibrary::CreateIteratorResultObject
                     ((JavascriptLibrary *)thisObj,keyValueTuple,false);
    }
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)library,-0x7ff5ebf2,L"Set Iterator.prototype.next");
}

Assistant:

Var JavascriptSetIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptSetIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedSetIterator, _u("Set Iterator.prototype.next"));
        }

        JavascriptSetIterator* iterator = VarTo<JavascriptSetIterator>(thisObj);
        JavascriptSet* set = iterator->m_set;
        auto& setIterator = iterator->m_setIterator;

        if (set == nullptr || !setIterator.Next())
        {
            iterator->m_set = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        auto value = setIterator.Current();
        Var result;

        if (iterator->m_kind == JavascriptSetIteratorKind::KeyAndValue)
        {
            JavascriptArray* keyValueTuple = library->CreateArray(2);
            keyValueTuple->SetItem(0, value, PropertyOperation_None);
            keyValueTuple->SetItem(1, value, PropertyOperation_None);
            result = keyValueTuple;
        }
        else
        {
            Assert(iterator->m_kind == JavascriptSetIteratorKind::Value);
            result = value;
        }

        return library->CreateIteratorResultObject(result);
    }